

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

int bifinh(voccxdef *voc,vocidef *v,objnum cls)

{
  int iVar1;
  uint uVar2;
  short in_DX;
  voccxdef *in_RSI;
  objnum *sc;
  int i;
  short *psVar3;
  undefined2 in_stack_ffffffffffffffe4;
  
  if (in_RSI != (voccxdef *)0x0) {
    psVar3 = (short *)((long)&in_RSI->voccxtio + 6);
    for (uVar2 = (uint)*(byte *)&in_RSI->voccxerr; uVar2 != 0; uVar2 = uVar2 - 1) {
      if ((*psVar3 == in_DX) ||
         (iVar1 = bifinh(in_RSI,(vocidef *)CONCAT26(in_DX,CONCAT24(in_stack_ffffffffffffffe4,uVar2))
                         ,(objnum)((ulong)psVar3 >> 0x30)), iVar1 != 0)) {
        return 1;
      }
      psVar3 = psVar3 + 1;
    }
  }
  return 0;
}

Assistant:

int bifinh(voccxdef *voc, vocidef *v, objnum cls)
{
    int     i;
    objnum *sc;

    if (!v) return(FALSE);
    for (i = v->vocinsc, sc = v->vocisc ; i ; ++sc, --i)
    {
        if (*sc == cls
            || bifinh(voc, vocinh(voc, *sc), cls))
            return(TRUE);
    }
    return(FALSE);
}